

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod_set.c
# Opt level: O2

acmod_id_t acmod_set_enum_init(acmod_set_t *acmod_set,acmod_id_t base)

{
  cell_id_t cVar1;
  
  if (acmod_set->n_multi != 0) {
    cVar1 = itree_enum_init(acmod_set->multi_idx[base]);
    return cVar1;
  }
  return 0xffffffff;
}

Assistant:

acmod_id_t
acmod_set_enum_init(acmod_set_t *acmod_set,
		    acmod_id_t base)
{
    cell_index_t ret;

    if (acmod_set->n_multi == 0) {
	/* none defined */

	return NO_ACMOD;
    }

    ret = itree_enum_init(acmod_set->multi_idx[base]);

    if (ret != NULL_INDEX) {
	return ret;
    }
    else {
	return NO_ACMOD;
    }
}